

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

int hfile_oflags(char *mode)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  do {
    bVar1 = *mode;
    if (bVar1 < 0x72) {
      if (bVar1 == 0x2b) {
        uVar3 = 2;
      }
      else {
        if (bVar1 == 0x61) {
          uVar2 = uVar2 | 0x440;
          goto LAB_0011035e;
        }
        if (bVar1 == 0) {
          return uVar2 | uVar3;
        }
      }
    }
    else if (bVar1 == 0x77) {
      uVar2 = uVar2 | 0x240;
LAB_0011035e:
      uVar3 = 1;
    }
    else if (bVar1 == 0x72) {
      uVar3 = 0;
    }
    mode = (char *)((byte *)mode + 1);
  } while( true );
}

Assistant:

int hfile_oflags(const char *mode)
{
    int rdwr = 0, flags = 0;
    const char *s;
    for (s = mode; *s; s++)
        switch (*s) {
        case 'r': rdwr = O_RDONLY;  break;
        case 'w': rdwr = O_WRONLY; flags |= O_CREAT | O_TRUNC;  break;
        case 'a': rdwr = O_WRONLY; flags |= O_CREAT | O_APPEND;  break;
        case '+': rdwr = O_RDWR;  break;
        default:  break;
        }

#ifdef O_BINARY
    flags |= O_BINARY;
#endif

    return rdwr | flags;
}